

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::DeadBranchElimPass::AddBlocksWithBackEdge
          (DeadBranchElimPass *this,uint32_t cont_id,uint32_t header_id,uint32_t merge_id,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *blocks_with_back_edges)

{
  bool bVar1;
  reference pvVar2;
  IRContext *this_00;
  BasicBlock *this_01;
  value_type *__x;
  value_type *__x_00;
  value_type *__x_01;
  anon_class_32_4_8ddbec92 local_100;
  function<void_(unsigned_int_*)> local_e0;
  bool local_b9;
  BasicBlock *pBStack_b8;
  bool has_back_edge;
  BasicBlock *bb;
  undefined1 local_a8 [4];
  uint32_t bb_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> work_list;
  undefined1 local_60 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  visited;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *blocks_with_back_edges_local;
  undefined1 local_18 [4];
  uint32_t merge_id_local;
  uint32_t header_id_local;
  uint32_t cont_id_local;
  DeadBranchElimPass *this_local;
  
  visited._M_h._M_single_bucket = (__node_base_ptr)blocks_with_back_edges;
  blocks_with_back_edges_local._4_4_ = merge_id;
  local_18 = (undefined1  [4])header_id;
  merge_id_local = cont_id;
  _header_id_local = this;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_60);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)local_60,
           (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            *)&merge_id_local,__x);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)local_60,
           (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            *)local_18,__x_00);
  work_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                         local_60,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)((long)&blocks_with_back_edges_local + 4),__x_01);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,&merge_id_local);
  while (bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
    bb._4_4_ = *pvVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
    this_00 = Pass::context((Pass *)this);
    this_01 = IRContext::get_instr_block(this_00,bb._4_4_);
    local_b9 = false;
    local_100.header_id = (uint32_t)local_18;
    local_100.visited =
         (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *)local_60;
    local_100.work_list = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8;
    local_100.has_back_edge = &local_b9;
    pBStack_b8 = this_01;
    std::function<void(unsigned_int*)>::
    function<spvtools::opt::DeadBranchElimPass::AddBlocksWithBackEdge(unsigned_int,unsigned_int,unsigned_int,std::unordered_set<spvtools::opt::BasicBlock*,std::hash<spvtools::opt::BasicBlock*>,std::equal_to<spvtools::opt::BasicBlock*>,std::allocator<spvtools::opt::BasicBlock*>>*)::__0,void>
              ((function<void(unsigned_int*)> *)&local_e0,&local_100);
    BasicBlock::ForEachSuccessorLabel(this_01,&local_e0);
    std::function<void_(unsigned_int_*)>::~function(&local_e0);
    if ((local_b9 & 1U) != 0) {
      std::
      unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
      ::insert((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                *)visited._M_h._M_single_bucket,&stack0xffffffffffffff48);
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_60);
  return;
}

Assistant:

void DeadBranchElimPass::AddBlocksWithBackEdge(
    uint32_t cont_id, uint32_t header_id, uint32_t merge_id,
    std::unordered_set<BasicBlock*>* blocks_with_back_edges) {
  std::unordered_set<uint32_t> visited;
  visited.insert(cont_id);
  visited.insert(header_id);
  visited.insert(merge_id);

  std::vector<uint32_t> work_list;
  work_list.push_back(cont_id);

  while (!work_list.empty()) {
    uint32_t bb_id = work_list.back();
    work_list.pop_back();

    BasicBlock* bb = context()->get_instr_block(bb_id);

    bool has_back_edge = false;
    bb->ForEachSuccessorLabel([header_id, &visited, &work_list,
                               &has_back_edge](uint32_t* succ_label_id) {
      if (visited.insert(*succ_label_id).second) {
        work_list.push_back(*succ_label_id);
      }
      if (*succ_label_id == header_id) {
        has_back_edge = true;
      }
    });

    if (has_back_edge) {
      blocks_with_back_edges->insert(bb);
    }
  }
}